

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void printInt64Bang(SStream *O,int64_t val)

{
  int64_t val_local;
  SStream *O_local;
  
  if (val < 0) {
    if (val < -9) {
      SStream_concat(O,"#-0x%lx",-val);
    }
    else {
      SStream_concat(O,"#-%lu",-val);
    }
  }
  else if (val < 10) {
    SStream_concat(O,"#%lu",val);
  }
  else {
    SStream_concat(O,"#0x%lx",val);
  }
  return;
}

Assistant:

void printInt64Bang(SStream *O, int64_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "#0x%"PRIx64, val);
		else
			SStream_concat(O, "#%"PRIu64, val);
	} else {
		if (val <- HEX_THRESHOLD)
			SStream_concat(O, "#-0x%"PRIx64, -val);
		else
			SStream_concat(O, "#-%"PRIu64, -val);
	}
}